

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest2 *this,_shader_stage *referencing_stage)

{
  ostream *poVar1;
  char *this_00;
  stringstream result;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = 
  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void testSubroutineType(out vec4 test_argument);\n\nsubroutine(testSubroutineType) void fs_subroutine(out vec4 test_argument)\n{\n    test_argument = vec4(1, 0, 0, 0);\n}\n\nout vec4 result;\n\nsubroutine uniform testSubroutineType test_fs_subroutine;\n\nvoid main()\n{\n    "
  ;
  poVar1 = std::operator<<(&local_190,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void testSubroutineType(out vec4 test_argument);\n\nsubroutine(testSubroutineType) void fs_subroutine(out vec4 test_argument)\n{\n    test_argument = vec4(1, 0, 0, 0);\n}\n\nout vec4 result;\n\nsubroutine uniform testSubroutineType test_fs_subroutine;\n\nvoid main()\n{\n    "
                          );
  getSubroutineUniformName_abi_cxx11_(&local_1c0,(NegativeTest2 *)this_00,referencing_stage);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,"(result);\n}\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest2::getFragmentShaderBody(const Utils::_shader_stage& referencing_stage) const
{
	std::stringstream result;

	/* Form the pre-amble */
	result << "#version 400\n"
			  "\n"
			  "#extension GL_ARB_shader_subroutine : require\n"
			  "\n"
			  "subroutine void testSubroutineType(out vec4 test_argument);\n"
			  "\n"
			  /* Define a subroutine */
			  "subroutine(testSubroutineType) void fs_subroutine(out vec4 test_argument)\n"
			  "{\n"
			  "    test_argument = vec4(1, 0, 0, 0);\n"
			  "}\n"
			  "\n"
			  /* Define output variables */
			  "out vec4 result;\n"
			  "\n"
			  /* Define uniforms */
			  "subroutine uniform testSubroutineType test_fs_subroutine;\n"
			  "\n"
			  /* Define main() */
			  "void main()\n"
			  "{\n"
			  "    "
		   << getSubroutineUniformName(referencing_stage) << "(result);\n"
															 "}\n";

	return result.str();
}